

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O3

unsigned_short toml::from_string<unsigned_short,unsigned_int>(string *str,uint *opt)

{
  uint uVar1;
  unsigned_short v;
  istringstream iss;
  istringstream local_190 [120];
  ios_base local_118 [264];
  
  uVar1 = *opt;
  std::__cxx11::istringstream::istringstream(local_190,(string *)str,_S_in);
  std::istream::_M_extract<unsigned_short>((ushort *)local_190);
  std::__cxx11::istringstream::~istringstream(local_190);
  std::ios_base::~ios_base(local_118);
  return (unsigned_short)uVar1;
}

Assistant:

T from_string(const std::string& str, U&& opt)
{
    T v(static_cast<T>(std::forward<U>(opt)));
    std::istringstream iss(str);
    iss >> v;
    return v;
}